

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O0

void iutest::detail::PrintTo<char16_t,std::char_traits<char16_t>>
               (basic_string_view<char16_t,_std::char_traits<char16_t>_> *value,iu_ostream *os)

{
  char16_t *str_00;
  allocator<char16_t> local_39;
  undefined1 local_38 [8];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> str;
  iu_ostream *os_local;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> *value_local;
  
  str.field_2._8_8_ = os;
  std::allocator<char16_t>::allocator(&local_39);
  std::__cxx11::u16string::
  u16string<std::basic_string_view<char16_t,std::char_traits<char16_t>>,void>
            ((u16string *)local_38,value,&local_39);
  std::allocator<char16_t>::~allocator(&local_39);
  str_00 = std::__cxx11::
           basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::c_str
                     ((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                       *)local_38);
  UniversalTersePrint(str_00,(iu_ostream *)str.field_2._8_8_);
  std::__cxx11::u16string::~u16string((u16string *)local_38);
  return;
}

Assistant:

inline void PrintTo(const ::std::basic_string_view<CharT, Traits>& value, iu_ostream* os)
{
    const ::std::basic_string<CharT, Traits> str{ value };
    UniversalTersePrint(str.c_str(), os);
}